

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  size_type *psVar1;
  StreamingListener *pSVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  char **ppcVar7;
  char *in_RDX;
  StreamingListener *this_00;
  ulong uVar8;
  char *pcVar9;
  undefined8 uVar10;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  string local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  char **local_d0;
  char *local_c8;
  char *local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  int local_4c;
  string local_48;
  
  pSVar2 = (StreamingListener *)(test_part_result->file_name_)._M_string_length;
  if (pSVar2 != (StreamingListener *)0x0) {
    pSVar2 = (StreamingListener *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  this_00 = (StreamingListener *)0x12eb11;
  if (pSVar2 != (StreamingListener *)0x0) {
    this_00 = pSVar2;
  }
  UrlEncode_abi_cxx11_(&local_48,this_00,in_RDX);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x12fe3f);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_e0 = *puVar6;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar6;
    local_f0 = (ulong *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_4c = test_part_result->line_number_;
  StreamableToString<int>(&local_90,&local_4c);
  uVar8 = 0xf;
  if (local_f0 != &local_e0) {
    uVar8 = local_e0;
  }
  if (uVar8 < local_90._M_string_length + local_e8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar10 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_90._M_string_length + local_e8) goto LAB_00128328;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00128328:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90._M_dataplus._M_p);
  }
  local_130 = &local_120;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_120 = *plVar3;
    uStack_118 = puVar4[3];
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  ppcVar7 = (char **)(plVar3 + 2);
  if ((char **)*plVar3 == ppcVar7) {
    local_c0 = *ppcVar7;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *ppcVar7;
    local_d0 = (char **)*plVar3;
  }
  local_c8 = (char *)plVar3[1];
  *plVar3 = (long)ppcVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  UrlEncode_abi_cxx11_
            (&local_b0,(StreamingListener *)(test_part_result->message_)._M_dataplus._M_p,local_c8);
  pcVar9 = (char *)0xf;
  if (local_d0 != &local_c0) {
    pcVar9 = local_c0;
  }
  if (pcVar9 < local_c8 + local_b0._M_string_length) {
    uVar10 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_c8 + local_b0._M_string_length <= (ulong)uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00128463;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
LAB_00128463:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_110.field_2._M_allocated_capacity = *psVar1;
    local_110.field_2._8_8_ = puVar4[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar1;
    local_110._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_110._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,(ulong)(local_c0 + 1));
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }